

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::FboApiTestGroup::init(FboApiTestGroup *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  ContextInfo *pCVar2;
  int iVar3;
  int extraout_EAX;
  iterator iVar4;
  FboApiCase *pFVar5;
  _Iter in_R8;
  code *pcVar6;
  code *test;
  insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  allocator<char> local_81;
  key_type local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  p_Var1 = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  pCVar2 = ((this->super_TestCaseGroup).m_context)->m_contextInfo;
  __result.iter._M_node = in_R8._M_node;
  __result.container =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)p_Var1;
  local_60._24_8_ = p_Var1;
  local_40 = p_Var1;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (pCVar2->m_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pCVar2->m_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,__result)
  ;
  iVar3 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GL_OES_fbo_render_mipmap",&local_81);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"valid_tex2d_attachments",
             "Valid 2D texture attachments",validTex2DAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"valid_texcube_attachments",
             "Valid cubemap attachments",validTexCubeAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"valid_rbo_attachments",
             "Valid renderbuffer attachments",validRboAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  pcVar6 = attachToDefaultFramebufferTest;
  test = notSupportedTest;
  if (iVar3 != 0) {
    pcVar6 = notSupportedTest;
  }
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attach_to_default_fbo",
             "Invalid usage: attaching to default FBO",pcVar6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"invalid_tex2d_attachments",
             "Invalid 2D texture attachments",invalidTex2DAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"invalid_texcube_attachments",
             "Invalid cubemap attachments",invalidTexCubeAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"invalid_rbo_attachments",
             "Invalid renderbuffer attachments",invalidRboAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attach_names",
             "Attach allocated names without objects",attachNamesTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  pcVar6 = textureLevelsWithRenderToMipmapTest;
  if (iVar4._M_node == p_Var1) {
    pcVar6 = textureLevelsTest;
  }
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"texture_levels",
             "Valid and invalid texturel levels",pcVar6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  if (iVar3 == 0) {
    test = attachmentQueryDefaultFboTest;
  }
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attachment_query_default_fbo",
             "Query attachments from default FBO",test);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attachment_query_empty_fbo",
             "Query attachments from empty FBO",attachmentQueryEmptyFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attachment_query_tex2d",
             "Query 2d texture attachment properties",attachmentQueryTex2DTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attachment_query_texcube",
             "Query cubemap attachment properties",attachmentQueryTexCubeTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"attachment_query_rbo",
             "Query renderbuffer attachment properties",attachmentQueryRboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_bound_fbo",
             "Delete 2d texture attached to currently bound FBO",deleteTex2DAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"delete_tex_cube_attached_to_bound_fbo",
             "Delete cubemap attached to currently bound FBO",deleteTexCubeAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_bound_fbo",
             "Delete renderbuffer attached to currently bound FBO",deleteRboAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_not_bound_fbo",
             "Delete 2d texture attached to FBO",deleteTex2DAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,
             "delete_tex_cube_attached_to_not_bound_fbo","Delete cubemap attached to FBO",
             deleteTexCubeAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  pFVar5 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar5,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_not_bound_fbo",
             "Delete renderbuffer attached to FBO",deleteRboAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar5);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  return extraout_EAX;
}

Assistant:

void FboApiTestGroup::init (void)
{
	std::set<std::string> extensions;
	std::copy(m_context.getContextInfo().getExtensions().begin(), m_context.getContextInfo().getExtensions().end(), std::inserter(extensions, extensions.begin()));

	bool	defaultFboIsZero	= m_context.getRenderContext().getDefaultFramebuffer() == 0;
	bool	hasRenderToMipmap	= extensions.find("GL_OES_fbo_render_mipmap") != extensions.end();

	// Valid attachments
	addChild(new FboApiCase(m_context, "valid_tex2d_attachments",					"Valid 2D texture attachments",							validTex2DAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_texcube_attachments",					"Valid cubemap attachments",							validTexCubeAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_rbo_attachments",						"Valid renderbuffer attachments",						validRboAttachmentsTest));

	// Invalid attachments
	addChild(new FboApiCase(m_context, "attach_to_default_fbo",						"Invalid usage: attaching to default FBO",				defaultFboIsZero ? attachToDefaultFramebufferTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "invalid_tex2d_attachments",					"Invalid 2D texture attachments",						invalidTex2DAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_texcube_attachments",				"Invalid cubemap attachments",							invalidTexCubeAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_rbo_attachments",					"Invalid renderbuffer attachments",						invalidRboAttachmentTest));
	addChild(new FboApiCase(m_context, "attach_names",								"Attach allocated names without objects",				attachNamesTest));

	addChild(new FboApiCase(m_context, "texture_levels",							"Valid and invalid texturel levels",					hasRenderToMipmap ? textureLevelsWithRenderToMipmapTest : textureLevelsTest));

	// Attachment queries
	addChild(new FboApiCase(m_context, "attachment_query_default_fbo",				"Query attachments from default FBO",					defaultFboIsZero ? attachmentQueryDefaultFboTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "attachment_query_empty_fbo",				"Query attachments from empty FBO",						attachmentQueryEmptyFboTest));
	addChild(new FboApiCase(m_context, "attachment_query_tex2d",					"Query 2d texture attachment properties",				attachmentQueryTex2DTest));
	addChild(new FboApiCase(m_context, "attachment_query_texcube",					"Query cubemap attachment properties",					attachmentQueryTexCubeTest));
	addChild(new FboApiCase(m_context, "attachment_query_rbo",						"Query renderbuffer attachment properties",				attachmentQueryRboTest));

	// Delete attachments
	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_bound_fbo",		"Delete 2d texture attached to currently bound FBO",	deleteTex2DAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_bound_fbo",		"Delete cubemap attached to currently bound FBO",		deleteTexCubeAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_bound_fbo",			"Delete renderbuffer attached to currently bound FBO",	deleteRboAttachedToBoundFboTest));

	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_not_bound_fbo",	"Delete 2d texture attached to FBO",					deleteTex2DAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_not_bound_fbo",	"Delete cubemap attached to FBO",						deleteTexCubeAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_not_bound_fbo",		"Delete renderbuffer attached to FBO",					deleteRboAttachedToNotBoundFboTest));
}